

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

void __thiscall Node::OutputField(Node *this,ostream *os)

{
  ostream *poVar1;
  long *plVar2;
  int iVar3;
  string local_c8;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  long *local_88;
  long local_80;
  long local_78 [2];
  string local_68;
  string local_48;
  
  for (; this->Type == 0x1f5; this = this->Tree[1]) {
    OutputField(this->Tree[0],os);
  }
  if (this->Type == 0x108) {
    iVar3 = 0;
    if (0 < Level) {
      iVar3 = Level;
    }
    local_a8 = local_98;
    std::__cxx11::string::_M_construct((ulong)&local_a8,(char)iVar3);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_a8,local_a0);
    Expression_abi_cxx11_(&local_c8,this->Tree[1]);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_c8._M_dataplus._M_p,local_c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".ReMap(FieldBase, ",0x12);
    Expression_abi_cxx11_(&local_48,this->Tree[0]);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,");",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    poVar1 = (ostream *)std::ostream::flush();
    iVar3 = 0;
    if (0 < Level) {
      iVar3 = Level;
    }
    local_88 = local_78;
    std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar3);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_88,local_80);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"FieldBase += ",0xd);
    Expression_abi_cxx11_(&local_68,this->Tree[0]);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,";",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != local_78) {
      operator_delete(local_88,local_78[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"// **** This shouldn\'t be possible ***** @ ",0x2b);
    plVar2 = (long *)std::ostream::operator<<((ostream *)os,this->lineno);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    poVar1 = (ostream *)std::ostream::flush();
    iVar3 = 0;
    if (0 < Level) {
      iVar3 = Level;
    }
    local_a8 = local_98;
    std::__cxx11::string::_M_construct((ulong)&local_a8,(char)iVar3);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_a8,local_a0);
    genname(&local_c8,&this->TextValue);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  return;
}

Assistant:

void Node::OutputField(
	std::ostream& os	/**< iostream to write C++ code to */
)
{
	switch(Type)
	{
	case BAS_N_LIST:

		Tree[0]->OutputField(os);
		Tree[1]->OutputField(os);

		break;

	case BAS_S_AS:
		os << Indent() << Tree[1]->Expression() <<
			".ReMap(FieldBase, " << Tree[0]->Expression() <<
			");" << std::endl <<
			Indent() << "FieldBase += " << Tree[0]->Expression() << ";" << std::endl;
		break;

	default:
		os << "// **** This shouldn't be possible ***** @ " << lineno << std::endl <<
			Indent() << genname(TextValue);
		break;
	}
}